

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_operation.cpp
# Opt level: O1

string * __thiscall
bidfx_public_api::price::pixie::ControlOperation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ControlOperation *this,ControlOperationEnum control)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 0) {
    pcVar2 = "REFRESH";
    pcVar1 = "";
  }
  else if ((int)this == 1) {
    pcVar2 = "TOGGLE";
    pcVar1 = "";
  }
  else {
    pcVar2 = "NONE";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ControlOperation::ToString(ControlOperationEnum control)
{
    if (control == ControlOperationEnum::TOGGLE)
    {
        return "TOGGLE";
    }
    else if (control == ControlOperationEnum::REFRESH)
    {
        return "REFRESH";
    }

    return "NONE";
}